

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pool.cc
# Opt level: O1

CRYPTO_BUFFER_POOL * CRYPTO_BUFFER_POOL_new(void)

{
  CRYPTO_BUFFER_POOL *orig_ptr;
  _LHASH *p_Var1;
  
  orig_ptr = (CRYPTO_BUFFER_POOL *)OPENSSL_zalloc(0x50);
  if (orig_ptr != (CRYPTO_BUFFER_POOL *)0x0) {
    p_Var1 = OPENSSL_lh_new(CRYPTO_BUFFER_hash,CRYPTO_BUFFER_cmp);
    orig_ptr->bufs = (lhash_st_CRYPTO_BUFFER *)p_Var1;
    if (p_Var1 != (_LHASH *)0x0) {
      CRYPTO_MUTEX_init(&orig_ptr->lock);
      RAND_bytes((uchar *)orig_ptr->hash_key,0x10);
      return orig_ptr;
    }
    OPENSSL_free(orig_ptr);
  }
  return (CRYPTO_BUFFER_POOL *)0x0;
}

Assistant:

CRYPTO_BUFFER_POOL *CRYPTO_BUFFER_POOL_new(void) {
  CRYPTO_BUFFER_POOL *pool = reinterpret_cast<CRYPTO_BUFFER_POOL *>(
      OPENSSL_zalloc(sizeof(CRYPTO_BUFFER_POOL)));
  if (pool == NULL) {
    return NULL;
  }

  pool->bufs = lh_CRYPTO_BUFFER_new(CRYPTO_BUFFER_hash, CRYPTO_BUFFER_cmp);
  if (pool->bufs == NULL) {
    OPENSSL_free(pool);
    return NULL;
  }

  CRYPTO_MUTEX_init(&pool->lock);
  RAND_bytes((uint8_t *)&pool->hash_key, sizeof(pool->hash_key));

  return pool;
}